

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O1

char * blogc_get_variable(char *name,bc_trie_t *global,bc_trie_t *local)

{
  char *pcVar1;
  
  if ((local != (bc_trie_t *)0x0) &&
     (pcVar1 = (char *)bc_trie_lookup(local,name), pcVar1 != (char *)0x0)) {
    return pcVar1;
  }
  if (global == (bc_trie_t *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = (char *)bc_trie_lookup(global,name);
  return pcVar1;
}

Assistant:

const char*
blogc_get_variable(const char *name, bc_trie_t *global, bc_trie_t *local)
{
    const char *rv = NULL;
    if (local != NULL) {
        rv = bc_trie_lookup(local, name);
        if (rv != NULL)
            return rv;
    }
    if (global != NULL)
        rv = bc_trie_lookup(global, name);
    return rv;
}